

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void UtttHashTest(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  reference plVar5;
  reference pIVar6;
  ostream *poVar7;
  size_type sVar8;
  size_type sVar9;
  undefined1 uVar10;
  pair<std::__detail::_Node_iterator<uttt::IBoard,_true,_true>,_bool> pVar11;
  IBoard b_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *__range3_1;
  pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_> it;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
  *__range2_2;
  IBoard b_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  *__range2_1;
  unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
  hashes;
  IBoard b2;
  long m;
  iterator __end3;
  iterator __begin3;
  vector<long,_std::allocator<long>_> *__range3;
  vector<long,_std::allocator<long>_> moves;
  IBoard b;
  iterator __end2;
  iterator __begin2;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  *__range2;
  int i;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set2;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  set1;
  IBoard board;
  pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  *in_stack_fffffffffffffd58;
  pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  *in_stack_fffffffffffffd60;
  value_type *in_stack_fffffffffffffd68;
  IBoard *in_stack_fffffffffffffd70;
  IBoard *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffdc8;
  __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
  local_208;
  undefined1 *local_200;
  ulong local_1f8;
  undefined1 auStack_1f0 [24];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false>
  local_1d8;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false>
  local_1d0;
  undefined1 *local_1c8;
  size_t local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  _Node_iterator_base<uttt::IBoard,_true> local_198;
  _Node_iterator_base<uttt::IBoard,_true> local_190;
  undefined1 *local_188;
  undefined1 local_180 [56];
  _Node_iterator_base<uttt::IBoard,_true> local_148;
  undefined1 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  long local_120;
  long *local_118;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_110;
  undefined1 *local_108;
  undefined1 local_100 [16];
  IBoard *in_stack_ffffffffffffff10;
  _Node_iterator_base<uttt::IBoard,_true> local_c8;
  _Node_iterator_base<uttt::IBoard,_true> local_c0;
  undefined1 *local_b8;
  int local_ac;
  _Node_iterator_base<uttt::IBoard,_true> local_a8;
  undefined1 local_a0;
  undefined1 local_50 [80];
  
  uttt::IBoard::IBoard((IBoard *)in_stack_fffffffffffffd60);
  std::
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  ::unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                   *)0x1ed88b);
  std::
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  ::unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                   *)0x1ed898);
  pVar11 = std::
           unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
           ::insert((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                     *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_a8._M_cur = (__node_type *)pVar11.first.super__Node_iterator_base<uttt::IBoard,_true>._M_cur
  ;
  uVar10 = pVar11.second;
  local_a0 = uVar10;
  for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
    std::
    unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
    ::clear((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
             *)0x1ed8f0);
    local_b8 = local_50;
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::begin((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                  *)in_stack_fffffffffffffd58);
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::end((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                *)in_stack_fffffffffffffd58);
    while( true ) {
      bVar4 = std::__detail::operator!=(&local_c0,&local_c8);
      if (!bVar4) break;
      pIVar6 = std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator*
                         ((_Node_iterator<uttt::IBoard,_true,_true> *)0x1ed955);
      uVar1 = *(undefined8 *)((pIVar6->micro)._M_elems + 6);
      uVar2._0_4_ = pIVar6->macro;
      uVar2._4_2_ = (pIVar6->micro)._M_elems[0];
      uVar2._6_2_ = (pIVar6->micro)._M_elems[1];
      uVar3 = *(undefined8 *)((pIVar6->micro)._M_elems + 2);
      uttt::IBoard::GetPossibleMoves((IBoard *)CONCAT17(uVar10,in_stack_fffffffffffffdc8));
      local_108 = local_100;
      local_110._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd58);
      local_118 = (long *)std::vector<long,_std::allocator<long>_>::end
                                    ((vector<long,_std::allocator<long>_> *)
                                     in_stack_fffffffffffffd58);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           in_stack_fffffffffffffd60,
                           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           in_stack_fffffffffffffd58);
        if (!bVar4) break;
        plVar5 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*(&local_110);
        local_120 = *plVar5;
        local_138 = uVar2;
        uStack_130 = uVar3;
        local_128 = uVar1;
        uttt::IBoard::ApplyMove(in_stack_fffffffffffffd70,(IMove *)in_stack_fffffffffffffd68);
        pVar11 = std::
                 unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                 ::insert((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                           *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_148._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<uttt::IBoard,_true>._M_cur;
        local_140 = pVar11.second;
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&local_110);
      }
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd70);
      std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator++
                ((_Node_iterator<uttt::IBoard,_true,_true> *)in_stack_fffffffffffffd60);
    }
    std::
    unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
    ::operator=((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                 *)in_stack_fffffffffffffd60,
                (unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                 *)in_stack_fffffffffffffd58);
    std::
    unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
    ::unordered_map((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                     *)0x1edaf6);
    local_188 = local_50;
    local_190._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::begin((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                  *)in_stack_fffffffffffffd58);
    local_198._M_cur =
         (__node_type *)
         std::
         unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
         ::end((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                *)in_stack_fffffffffffffd58);
    while( true ) {
      bVar4 = std::__detail::operator!=(&local_190,&local_198);
      if (!bVar4) break;
      pIVar6 = std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator*
                         ((_Node_iterator<uttt::IBoard,_true,_true> *)0x1edb5b);
      local_1a8 = *(undefined8 *)((pIVar6->micro)._M_elems + 6);
      local_1b8._0_4_ = pIVar6->macro;
      local_1b8._4_2_ = (pIVar6->micro)._M_elems[0];
      local_1b8._6_2_ = (pIVar6->micro)._M_elems[1];
      uStack_1b0 = *(undefined8 *)((pIVar6->micro)._M_elems + 2);
      local_1c0 = uttt::IBoard::Hash(in_stack_fffffffffffffd90);
      std::
      unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
      ::operator[]((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                    *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->first);
      std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::push_back
                ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      std::__detail::_Node_iterator<uttt::IBoard,_true,_true>::operator++
                ((_Node_iterator<uttt::IBoard,_true,_true> *)in_stack_fffffffffffffd60);
    }
    in_stack_fffffffffffffd90 = (IBoard *)std::operator<<((ostream *)&std::cout,"After iteration ");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffd90,local_ac + 1);
    poVar7 = std::operator<<(poVar7," set size = ");
    sVar8 = std::
            unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
            ::size((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1edc49);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
    std::operator<<(poVar7,'\n');
    in_stack_fffffffffffffd70 = (IBoard *)std::operator<<((ostream *)&std::cout,"hashes size = ");
    sVar9 = std::
            unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
            ::size((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                    *)0x1edc95);
    in_stack_fffffffffffffd68 =
         (value_type *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffd70,sVar9);
    std::operator<<((ostream *)in_stack_fffffffffffffd68,'\n');
    local_1c8 = local_180;
    local_1d0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
         ::begin((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                  *)in_stack_fffffffffffffd58);
    local_1d8._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
         ::end((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                *)in_stack_fffffffffffffd58);
    while( true ) {
      bVar4 = std::__detail::operator!=(&local_1d0,&local_1d8);
      if (!bVar4) break;
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false,_false>
      ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false,_false>
                   *)0x1edd1f);
      std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>::
      pair(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd60 =
           (pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_> *)
           std::operator<<((ostream *)&std::cout,"Hash family: ");
      in_stack_fffffffffffffd58 =
           (pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_> *)
           std::ostream::operator<<((ostream *)in_stack_fffffffffffffd60,local_1f8);
      std::operator<<((ostream *)in_stack_fffffffffffffd58,'\n');
      local_200 = auStack_1f0;
      local_208._M_current =
           (IBoard *)
           std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::begin
                     ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
                      in_stack_fffffffffffffd58);
      std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::end
                ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)in_stack_fffffffffffffd58);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                            *)in_stack_fffffffffffffd60,
                           (__normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
                            *)in_stack_fffffffffffffd58);
        if (!bVar4) break;
        __gnu_cxx::
        __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
        ::operator*(&local_208);
        uttt::IBoard::Print(in_stack_ffffffffffffff10);
        __gnu_cxx::
        __normal_iterator<uttt::IBoard_*,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>
        ::operator++(&local_208);
      }
      std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>::
      ~pair((pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_> *)
            0x1ede40);
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>,_false,_false>
                    *)in_stack_fffffffffffffd60);
    }
    std::
    unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>_>_>_>
                      *)0x1ede5f);
  }
  std::
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  ::~unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1ede91);
  std::
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  ::~unordered_set((unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
                    *)0x1ede9e);
  return;
}

Assistant:

void
UtttHashTest()
{
    uttt::IBoard board;
    std::unordered_set<uttt::IBoard> set1, set2;
    set1.insert(board);
    for (int i = 0; i < 2; ++i)
    {
        set2.clear();
        for (auto b : set1)
        {
            auto moves = b.GetPossibleMoves();
            for (auto m : moves)
            {
                auto b2 = b;
                b2.ApplyMove(m);
                set2.insert(b2);
            }
        }
        set1 = set2;
        std::unordered_map<std::size_t, std::vector<uttt::IBoard>> hashes;
        for (auto b : set1)
            hashes[b.Hash()].push_back(b);
        std::cout << "After iteration " << i + 1 << " set size = " << set1.size() << '\n';
        std::cout << "hashes size = " << hashes.size() << '\n';

        for (auto it : hashes)
        {
            std::cout << "Hash family: " << it.first << '\n';
            for (auto b : it.second)
                b.Print();
        }
    }
}